

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Box.H
# Opt level: O2

bool __thiscall amrex::Box::strictly_contains(Box *this,int i,int j,int k)

{
  bool bVar1;
  bool bVar2;
  
  if ((this->smallend).vect[0] < i) {
    bVar1 = false;
    bVar2 = false;
    if ((((i < (this->bigend).vect[0]) && (bVar2 = bVar1, (this->smallend).vect[1] < j)) &&
        (j < (this->bigend).vect[1])) && ((this->smallend).vect[2] < k)) {
      bVar2 = k < (this->bigend).vect[2];
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool strictly_contains (int i, int j, int k) const noexcept {
#endif
        return AMREX_D_TERM(i > smallend[0] && i < bigend[0],
                         && j > smallend[1] && j < bigend[1],
                         && k > smallend[2] && k < bigend[2]);
    }